

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractNumericFacetValidator::inheritFacet(AbstractNumericFacetValidator *this)

{
  uint uVar1;
  uint uVar2;
  AbstractNumericFacetValidator *this_00;
  XMLNumber *pXVar3;
  int baseFacetsDefined;
  int thisFacetsDefined;
  AbstractNumericFacetValidator *numBase;
  AbstractNumericFacetValidator *this_local;
  
  this_00 = (AbstractNumericFacetValidator *)
            DatatypeValidator::getBaseValidator(&this->super_DatatypeValidator);
  if (this_00 != (AbstractNumericFacetValidator *)0x0) {
    uVar1 = DatatypeValidator::getFacetsDefined(&this->super_DatatypeValidator);
    uVar2 = DatatypeValidator::getFacetsDefined((DatatypeValidator *)this_00);
    if (((uVar2 & 0x10) != 0) && ((uVar1 & 0x10) == 0)) {
      this->fEnumeration = this_00->fEnumeration;
      this->fEnumerationInherited = true;
      DatatypeValidator::setFacetsDefined(&this->super_DatatypeValidator,0x10);
    }
    if ((((uVar2 & 0x20) != 0) && ((uVar1 & 0x40) == 0)) && ((uVar1 & 0x20) == 0)) {
      pXVar3 = getMaxInclusive(this_00);
      this->fMaxInclusive = pXVar3;
      this->fMaxInclusiveInherited = true;
      DatatypeValidator::setFacetsDefined(&this->super_DatatypeValidator,0x20);
    }
    if ((((uVar2 & 0x40) != 0) && ((uVar1 & 0x40) == 0)) && ((uVar1 & 0x20) == 0)) {
      pXVar3 = getMaxExclusive(this_00);
      this->fMaxExclusive = pXVar3;
      this->fMaxExclusiveInherited = true;
      DatatypeValidator::setFacetsDefined(&this->super_DatatypeValidator,0x40);
    }
    if ((((uVar2 & 0x80) != 0) && ((uVar1 & 0x100) == 0)) && ((uVar1 & 0x80) == 0)) {
      pXVar3 = getMinInclusive(this_00);
      this->fMinInclusive = pXVar3;
      this->fMinInclusiveInherited = true;
      DatatypeValidator::setFacetsDefined(&this->super_DatatypeValidator,0x80);
    }
    if ((((uVar2 & 0x100) != 0) && ((uVar1 & 0x100) == 0)) && ((uVar1 & 0x80) == 0)) {
      pXVar3 = getMinExclusive(this_00);
      this->fMinExclusive = pXVar3;
      this->fMinExclusiveInherited = true;
      DatatypeValidator::setFacetsDefined(&this->super_DatatypeValidator,0x100);
    }
    (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0xd])();
    uVar1 = DatatypeValidator::getFixed(&this->super_DatatypeValidator);
    uVar2 = DatatypeValidator::getFixed((DatatypeValidator *)this_00);
    DatatypeValidator::setFixed(&this->super_DatatypeValidator,uVar1 | uVar2);
  }
  return;
}

Assistant:

void AbstractNumericFacetValidator::inheritFacet()
{

    AbstractNumericFacetValidator* numBase = (AbstractNumericFacetValidator*) getBaseValidator();
    if (!numBase)
        return;

    int thisFacetsDefined = getFacetsDefined();
    int baseFacetsDefined = numBase->getFacetsDefined();

    // inherit enumeration
    if ((( baseFacetsDefined & DatatypeValidator::FACET_ENUMERATION) != 0) &&
        (( thisFacetsDefined & DatatypeValidator::FACET_ENUMERATION) == 0))
    {
        fEnumeration = numBase->fEnumeration;
        fEnumerationInherited = true;
        setFacetsDefined(DatatypeValidator::FACET_ENUMERATION);
    }

    // inherit maxInclusive
    if ((( baseFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0) &&
        (( thisFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) == 0) &&
        (( thisFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) == 0) )
    {
        fMaxInclusive = numBase->getMaxInclusive();
        fMaxInclusiveInherited = true;
        setFacetsDefined(DatatypeValidator::FACET_MAXINCLUSIVE);
    }

    // inherit maxExclusive
    if ((( baseFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0) &&
        (( thisFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) == 0) &&
        (( thisFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) == 0) )
    {
        fMaxExclusive = numBase->getMaxExclusive();
        fMaxExclusiveInherited = true;
        setFacetsDefined(DatatypeValidator::FACET_MAXEXCLUSIVE);
    }

    // inherit minExclusive
    if ((( baseFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0) &&
        (( thisFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) == 0) &&
        (( thisFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) == 0) )
    {
        fMinInclusive = numBase->getMinInclusive();
        fMinInclusiveInherited = true;
        setFacetsDefined(DatatypeValidator::FACET_MININCLUSIVE);
    }

    // inherit minExclusive
    if ((( baseFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0) &&
        (( thisFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) == 0) &&
        (( thisFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) == 0) )
    {
        fMinExclusive = numBase->getMinExclusive();
        fMinExclusiveInherited = true;
        setFacetsDefined(DatatypeValidator::FACET_MINEXCLUSIVE);
    }

    inheritAdditionalFacet();

    // inherit "fixed" option
    setFixed(getFixed() | numBase->getFixed());

}